

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizerGenetic::Mutation(ChOptimizerGenetic *this)

{
  double dVar1;
  ChGenotype *pCVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar5 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  if (0 < *(int *)&(this->super_ChOptimizer).field_0x144) {
    lVar9 = 0;
    do {
      if (0 < (int)uVar5) {
        bVar8 = false;
        uVar7 = 0;
        do {
          while( true ) {
            uVar6 = uVar7 + 1;
            dVar11 = ChRandom();
            if (dVar11 <= this->mutation_prob) break;
            uVar7 = uVar6;
            if ((1 - (ulong)uVar5) + uVar6 == 1) {
              if (!bVar8) goto LAB_007ce781;
              goto LAB_007ce77a;
            }
          }
          dVar11 = (this->super_ChOptimizer).xv_sup[uVar7];
          dVar1 = (this->super_ChOptimizer).xv_inf[uVar7];
          if (this->mutation == BOUNDARY) {
            auVar13._0_8_ = ChRandom();
            auVar13._8_56_ = extraout_var_00;
            uVar3 = vcmpsd_avx512f(auVar13._0_16_,ZEXT816(0x3fe0000000000000),1);
            bVar8 = (bool)((byte)uVar3 & 1);
            dVar10 = (double)((ulong)bVar8 * (long)dVar1 + (ulong)!bVar8 * (long)dVar11);
          }
          else {
            dVar10 = 0.0;
            if (this->mutation == UNIFORM) {
              auVar12._0_8_ = ChRandom();
              auVar12._8_56_ = extraout_var;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = dVar1;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = dVar11 - dVar1;
              auVar4 = vfmadd213sd_fma(auVar14,auVar12._0_16_,auVar4);
              dVar10 = auVar4._0_8_;
            }
          }
          pCVar2 = this->population[lVar9];
          if ((pCVar2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= (long)uVar7) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          bVar8 = true;
          (pCVar2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[uVar7] = dVar10;
          pCVar2->need_eval = true;
          uVar7 = uVar6;
        } while (uVar6 != uVar5);
LAB_007ce77a:
        this->mutants = this->mutants + 1;
      }
LAB_007ce781:
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)&(this->super_ChOptimizer).field_0x144);
  }
  return;
}

Assistant:

void ChOptimizerGenetic::Mutation() {
    int nv = GetNumOfVars();
    double a1, a2, mutval;
    bool had_mutation;

    for (int i = 0; i < popsize; i++) {
        had_mutation = false;
        for (int mvar = 0; mvar < nv; mvar++) {
            if (ChRandom() <= mutation_prob) {
                // MUTATION of the fenotype variable...
                // Find the variable structure in variable linked list, with limits
                a1 = xv_inf[mvar];  // the random value of each variable
                a2 = xv_sup[mvar];  // must lie within the max/min
                // Perform mutation:
                switch (mutation) {
                    case MutationType::UNIFORM:
                        mutval = a1 + ChRandom() * (a2 - a1);
                        break;
                    case MutationType::BOUNDARY:
                        if (ChRandom() < 0.5)
                            mutval = a1;
                        else
                            mutval = a2;
                        break;
                    default:
                        mutval = 0;
                        break;
                }

                // store the mutated allele:
                population[i]->genes(mvar) = mutval;

                // the chromosomes have been changed, remember that
                // new fitness will be computed:
                population[i]->need_eval = true;

                had_mutation = true;
            }
        }
        if (had_mutation)
            mutants++;
    }
}